

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

SwapchainBuilder * __thiscall
vkb::SwapchainBuilder::add_fallback_present_mode
          (SwapchainBuilder *this,VkPresentModeKHR present_mode)

{
  VkPresentModeKHR local_c;
  
  local_c = present_mode;
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::push_back
            (&(this->info).desired_present_modes,&local_c);
  return this;
}

Assistant:

SwapchainBuilder& SwapchainBuilder::add_fallback_present_mode(VkPresentModeKHR present_mode) {
    info.desired_present_modes.push_back(present_mode);
    return *this;
}